

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxtick.cpp
# Opt level: O0

void processFile(MidiFile *midifile,Options *options)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  double dVar5;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Options *local_18;
  Options *options_local;
  MidiFile *midifile_local;
  
  local_18 = options;
  options_local = (Options *)midifile;
  poVar4 = std::operator<<((ostream *)&std::cout,"maxtick=");
  iVar3 = smf::MidiFile::getFileDurationInTicks((MidiFile *)options_local);
  std::ostream::operator<<(poVar4,iVar3);
  pOVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"quarters",&local_39);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\tquarters=");
    dVar5 = smf::MidiFile::getFileDurationInQuarters((MidiFile *)options_local);
    std::ostream::operator<<(poVar4,dVar5);
  }
  pOVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"seconds",&local_71);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\tseconds=");
    dVar5 = smf::MidiFile::getFileDurationInSeconds((MidiFile *)options_local);
    std::ostream::operator<<(poVar4,dVar5);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	cout << "maxtick=" << midifile.getFileDurationInTicks();
	if (options.getBoolean("quarters")) {
		cout << "\tquarters=" << midifile.getFileDurationInQuarters();
	}
	if (options.getBoolean("seconds")) {
		cout << "\tseconds=" << midifile.getFileDurationInSeconds();
	}
	cout << endl;
}